

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  int iVar1;
  uint i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    i = (uint)uVar2;
    while( true ) {
      if (pParse->nColCache <= i) {
        return;
      }
      iVar1 = pParse->aColCache[uVar2].iReg;
      if ((iVar1 < iReg) || (nReg + iReg <= iVar1)) break;
      cacheEntryClear(pParse,i);
    }
    uVar2 = (ulong)(i + 1);
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i = 0;
  while( i<pParse->nColCache ){
    struct yColCache *p = &pParse->aColCache[i];
    if( p->iReg >= iReg && p->iReg < iReg+nReg ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}